

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_stream.hpp
# Opt level: O2

void __thiscall boost::deflate::detail::inflate_stream::inflate_stream(inflate_stream *this)

{
  code *pcVar1;
  
  this->havedict_ = false;
  (this->bi_).v_ = 0;
  (this->bi_).n_ = 0;
  this->mode_ = HEAD;
  this->last_ = 0;
  this->dmax_ = 0x8000;
  pcVar1 = this->codes_;
  this->head_ = (gz_header *)0x0;
  (this->w_).p_._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  *(undefined8 *)
   ((long)&(this->w_).p_._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false> + 7) = 0;
  this->next_ = pcVar1;
  this->back_ = -1;
  this->lencode_ = pcVar1;
  this->distcode_ = pcVar1;
  window::reset(&this->w_,0xf);
  return;
}

Assistant:

inflate_stream()
    {
        w_.reset(15);
    }